

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_cross_platform.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  long lVar2;
  
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = &PTR__i1_00103db0;
  lVar2 = __dynamic_cast(puVar1,&i1::typeinfo,&impl1::typeinfo,0);
  if (lVar2 != 0) {
    operator_delete(puVar1,8);
    return 0;
  }
  __assert_fail("dynamic_cast<impl1*>(object.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_cross_platform.cpp"
                ,0x21,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(
#if defined(__cpp_variable_templates)
      di::bind<i1>.to<impl1>()
#else
      di::bind<i1>().to<impl1>()  // no variable templates
#endif
          );

  auto object = injector.create<std::unique_ptr<i1>>();
  assert(dynamic_cast<impl1*>(object.get()));
}